

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  Stream *pSVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int extraout_var;
  size_t in_RCX;
  void *__buf;
  Stream *in_RDI;
  ssize_t len;
  ssize_t len_1;
  string s;
  value_type *x;
  const_iterator __end2;
  const_iterator __begin2;
  Headers *__range2;
  ssize_t write_len;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff48;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  *this;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  local_60 [4];
  reference local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_30 [2];
  long local_20;
  Stream *local_10;
  long local_8;
  
  local_20 = 0;
  local_10 = in_RDI;
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar3 = std::__detail::operator!=(local_30,&local_38);
    if (!bVar3) {
      local_8 = Stream::write(local_10,0x451490,__buf,in_RCX);
      if (-1 < local_8) {
        local_8 = local_8 + local_20;
      }
      return local_8;
    }
    local_40 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                            *)0x1c2f38);
    ::std::__cxx11::string::string((string *)local_60);
    ::std::__cxx11::string::operator=((string *)local_60,(string *)local_40);
    ::std::__cxx11::string::operator+=((string *)local_60,": ");
    ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_40->second);
    ::std::__cxx11::string::operator+=((string *)local_60,"\r\n");
    pSVar1 = local_10;
    this = local_60;
    uVar5 = ::std::__cxx11::string::data();
    uVar6 = ::std::__cxx11::string::size();
    iVar4 = (*pSVar1->_vptr_Stream[6])(pSVar1,uVar5,uVar6);
    lVar2 = CONCAT44(extraout_var,iVar4);
    if (-1 < extraout_var) {
      local_20 = CONCAT44(extraout_var,iVar4) + local_20;
      lVar2 = local_8;
    }
    local_8 = lVar2;
    ::std::__cxx11::string::~string((string *)local_60);
    if (-1 >= extraout_var) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator++(this);
  }
  return local_8;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    std::string s;
    s = x.first;
    s += ": ";
    s += x.second;
    s += "\r\n";

    auto len = strm.write(s.data(), s.size());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}